

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O2

void __thiscall
geemuboi::test::core::CpuTest::verify_ld_r16_d16
          (CpuTest *this,uint8_t instruction,Registers *expected_regs)

{
  undefined2 uVar1;
  TypedExpectation<unsigned_short_(unsigned_short)> *this_00;
  char *message;
  MatcherBase<unsigned_short> local_a0;
  MockSpec<unsigned_short_(unsigned_short)> local_88;
  linked_ptr<int> local_68;
  AssertionResult gtest_ar;
  
  (this->regs).f = 0xf0;
  uVar1 = (this->regs).pc;
  testing::Matcher<unsigned_short>::Matcher((Matcher<unsigned_short> *)&local_a0,uVar1 + 1);
  MockMmu::gmock_read_word(&local_88,&this->mmu,(Matcher<unsigned_short> *)&local_a0);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::MockSpec<unsigned_short_(unsigned_short)>::InternalExpectedAt
                      (&local_88,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/cjuub[P]geemuboi/test/core/test_cpu.cpp"
                       ,0x32,"mmu","read_word(regs.pc + 1)");
  local_68.value_ = (int *)operator_new(4);
  *local_68.value_ = 0x3344;
  local_68.link_.next_ = &local_68.link_;
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<unsigned_short_(unsigned_short)> *)&gtest_ar,(ReturnAction *)&local_68);
  testing::internal::TypedExpectation<unsigned_short_(unsigned_short)>::WillOnce
            (this_00,(Action<unsigned_short_(unsigned_short)> *)&gtest_ar);
  testing::Action<unsigned_short_(unsigned_short)>::~Action
            ((Action<unsigned_short_(unsigned_short)> *)&gtest_ar);
  testing::internal::linked_ptr<int>::~linked_ptr(&local_68);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)&local_88.matchers_);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase(&local_a0);
  execute_instruction(this,instruction);
  expected_regs->f = 0xf0;
  expected_regs->pc = 3;
  verify_state_changes(this,expected_regs);
  local_88.function_mocker_._0_4_ =
       (*((this->cpu)._M_t.
          super___uniq_ptr_impl<geemuboi::core::ICpu,_std::default_delete<geemuboi::core::ICpu>_>.
          _M_t.
          super__Tuple_impl<0UL,_geemuboi::core::ICpu_*,_std::default_delete<geemuboi::core::ICpu>_>
          .super__Head_base<0UL,_geemuboi::core::ICpu_*,_false>._M_head_impl)->_vptr_ICpu[1])();
  local_a0._vptr_MatcherBase._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&gtest_ar,"cpu->get_cycles_executed()","3",(uint *)&local_88,
             (int *)&local_a0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_88);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cjuub[P]geemuboi/test/core/test_cpu.cpp"
               ,0x39,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a0,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_88);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

void verify_ld_r16_d16(uint8_t instruction, ICpu::Registers& expected_regs) {
        regs.f = ICpu::C_FLAG | ICpu::N_FLAG | ICpu::H_FLAG | ICpu::Z_FLAG;

        EXPECT_CALL(mmu, read_word(regs.pc + 1)).WillOnce(Return(0x3344));
        execute_instruction(instruction);

        expected_regs.f = ICpu::C_FLAG | ICpu::N_FLAG | ICpu::H_FLAG | ICpu::Z_FLAG;
        expected_regs.pc = 3;
        verify_state_changes(expected_regs);

        EXPECT_EQ(cpu->get_cycles_executed(), 3);
    }